

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_PutBlockList
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext)

{
  BLOB_RESULT BVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  LOGGER_LOG l_1;
  LOGGER_LOG p_Stack_20;
  uint putBlockListHttpStatus;
  LOGGER_LOG l;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE pIStack_10;
  IOTHUB_CLIENT_RESULT result;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pIStack_10 = uploadContext;
  if (uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    p_Stack_20 = xlogging_get_log_function();
    if (p_Stack_20 != (LOGGER_LOG)0x0) {
      (*p_Stack_20)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_PutBlockList",0x404,1,
                    "invalid argument uploadContext=%p",pIStack_10);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    l_1._4_4_ = 0;
    BVar1 = Blob_PutBlockList(uploadContext->blobHttpApiHandle,
                              uploadContext->blobStorageRelativePath,uploadContext->blockIdList,
                              (uint *)((long)&l_1 + 4),(BUFFER_HANDLE)0x0);
    if (BVar1 == BLOB_OK) {
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_PutBlockList",0x412,1,
                  "Failed sending block ID list to Blob Storage (%u)",CONCAT44(uVar3,l_1._4_4_));
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_PutBlockList(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext)
{
    IOTHUB_CLIENT_RESULT result;

    if (uploadContext == NULL)
    {
        LogError("invalid argument uploadContext=%p", uploadContext);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        unsigned int putBlockListHttpStatus = 0;

        // Do not PUT BLOCK LIST if result is not success (isSuccess == false)
        // Otherwise we could corrupt a blob with a partial update.
        if (Blob_PutBlockList(
                uploadContext->blobHttpApiHandle,
                uploadContext->blobStorageRelativePath,
                uploadContext->blockIdList, &putBlockListHttpStatus, NULL) != BLOB_OK)
        {
            LogError("Failed sending block ID list to Blob Storage (%u)", putBlockListHttpStatus);
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}